

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

void __thiscall
de::FilePath::split(FilePath *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *components)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long lVar5;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  bVar2 = isWinNetPath(this);
  if (bVar2) {
    std::operator+(&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   separator_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   separator_abi_cxx11_);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
               &local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar2 = isRootPath(this);
    if (bVar2) {
      bVar2 = beginsWithDrive(this);
      if (!bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(components,(value_type *)separator_abi_cxx11_);
      }
    }
  }
  lVar4 = 0;
  iVar3 = 0;
  do {
    iVar3 = (int)lVar4 - iVar3;
    lVar5 = lVar4;
    while( true ) {
      lVar4 = lVar5 + 1;
      if ((int)(this->m_path)._M_string_length <= lVar5) {
        if (0 < iVar3) {
          std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components
                     ,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
        return;
      }
      cVar1 = (this->m_path)._M_dataplus._M_p[lVar5];
      if ((cVar1 == '/') || (cVar1 == '\\')) break;
      iVar3 = iVar3 + 1;
      lVar5 = lVar4;
    }
    if (0 < iVar3) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                 &local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    iVar3 = (int)lVar4;
  } while( true );
}

Assistant:

void FilePath::split (std::vector<std::string>& components) const
{
	components.clear();

	int curCompStart = 0;
	int pos;

	if (isWinNetPath())
		components.push_back(separator + separator);
	else if (isRootPath() && !beginsWithDrive())
		components.push_back(separator);

	for (pos = 0; pos < (int)m_path.length(); pos++)
	{
		const char c = m_path[pos];

		if (isSeparator(c))
		{
			if (pos - curCompStart > 0)
				components.push_back(m_path.substr(curCompStart, pos - curCompStart));

			curCompStart = pos+1;
		}
	}

	if (pos - curCompStart > 0)
		components.push_back(m_path.substr(curCompStart, pos - curCompStart));
}